

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonConvertTextToBlob(JsonParse *pParse,sqlite3_context *pCtx)

{
  byte *pbVar1;
  u8 uVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *zIn;
  
  pcVar3 = pParse->zJson;
  uVar4 = jsonTranslateTextToBlob(pParse,0);
  uVar2 = pParse->oom;
  if ((int)uVar4 < 1 || uVar2 != '\0') {
LAB_001b972c:
    if (pCtx == (sqlite3_context *)0x0) goto LAB_001b976a;
    if (uVar2 != '\0') {
      sqlite3_result_error_nomem(pCtx);
      goto LAB_001b976a;
    }
  }
  else {
    zIn = pcVar3 + ((ulong)uVar4 - 1);
    iVar6 = uVar4 - 1;
    do {
      pbVar1 = (byte *)(zIn + 1);
      zIn = zIn + 1;
      iVar6 = iVar6 + 1;
    } while (""[*pbVar1] != '\0');
    if (*pbVar1 == 0) {
LAB_001b9726:
      if (0 < iVar6) {
        return 0;
      }
      goto LAB_001b972c;
    }
    iVar5 = json5Whitespace(zIn);
    iVar6 = iVar5 + iVar6;
    if (pcVar3[iVar6] == '\0') {
      pParse->hasNonstd = '\x01';
      goto LAB_001b9726;
    }
    if (pCtx == (sqlite3_context *)0x0) goto LAB_001b976a;
  }
  pCtx->isError = 1;
  sqlite3VdbeMemSetStr
            (pCtx->pOut,"malformed JSON",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
LAB_001b976a:
  jsonParseReset(pParse);
  return 1;
}

Assistant:

static int jsonConvertTextToBlob(
  JsonParse *pParse,           /* Initialize and fill this JsonParse object */
  sqlite3_context *pCtx        /* Report errors here */
){
  int i;
  const char *zJson = pParse->zJson;
  i = jsonTranslateTextToBlob(pParse, 0);
  if( pParse->oom ) i = -1;
  if( i>0 ){
#ifdef SQLITE_DEBUG
    assert( pParse->iDepth==0 );
    if( sqlite3Config.bJsonSelfcheck ){
      assert( jsonbValidityCheck(pParse, 0, pParse->nBlob, 0)==0 );
    }
#endif
    while( jsonIsspace(zJson[i]) ) i++;
    if( zJson[i] ){
      i += json5Whitespace(&zJson[i]);
      if( zJson[i] ){
        if( pCtx ) sqlite3_result_error(pCtx, "malformed JSON", -1);
        jsonParseReset(pParse);
        return 1;
      }
      pParse->hasNonstd = 1;
    }
  }
  if( i<=0 ){
    if( pCtx!=0 ){
      if( pParse->oom ){
        sqlite3_result_error_nomem(pCtx);
      }else{
        sqlite3_result_error(pCtx, "malformed JSON", -1);
      }
    }
    jsonParseReset(pParse);
    return 1;
  }
  return 0;
}